

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditorImage::AnalyzeTileFlags(CEditorImage *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int *in_RDI;
  int p;
  int y;
  int x;
  bool Opaque;
  int tx;
  int ty;
  int TileID;
  uchar *pPixelData;
  int th;
  int tw;
  int i;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  int local_2c;
  int local_28;
  int local_24;
  int local_c;
  
  if (in_RDI[2] == 0) {
    for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
      *(undefined1 *)((long)in_RDI + (long)local_c + 0xa8) = 4;
    }
  }
  else {
    mem_zero((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (uint)((ulong)in_RDI >> 0x20));
    iVar4 = *in_RDI / 0x10;
    iVar1 = in_RDI[1];
    if (iVar4 == iVar1 / 0x10) {
      lVar2 = *(long *)(in_RDI + 4);
      local_24 = 0;
      for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
        for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
          bVar3 = true;
          for (local_34 = 0; local_34 < iVar4; local_34 = local_34 + 1) {
            for (local_38 = 0; local_38 < iVar1 / 0x10; local_38 = local_38 + 1) {
              if (*(byte *)(lVar2 + (((local_28 * iVar4 + local_38) * *in_RDI + local_2c * iVar4 +
                                     local_34) * 4 + 3)) < 0xfa) {
                bVar3 = false;
                break;
              }
            }
          }
          if (bVar3) {
            *(byte *)((long)in_RDI + (long)local_24 + 0xa8) =
                 *(byte *)((long)in_RDI + (long)local_24 + 0xa8) | 4;
          }
          local_24 = local_24 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void CEditorImage::AnalyzeTileFlags()
{
	if(m_Format == CImageInfo::FORMAT_RGB)
	{
		for(int i = 0; i < 256; ++i)
			m_aTileFlags[i] = TILEFLAG_OPAQUE;
	}
	else
	{
		mem_zero(m_aTileFlags, sizeof(m_aTileFlags));

		int tw = m_Width/16; // tilesizes
		int th = m_Height/16;
		if(tw == th)
		{
			unsigned char *pPixelData = (unsigned char *)m_pData;

			int TileID = 0;
			for(int ty = 0; ty < 16; ty++)
				for(int tx = 0; tx < 16; tx++, TileID++)
				{
					bool Opaque = true;
					for(int x = 0; x < tw; x++)
						for(int y = 0; y < th; y++)
						{
							int p = (ty*tw+y)*m_Width + tx*tw+x;
							if(pPixelData[p*4+3] < 250)
							{
								Opaque = false;
								break;
							}
						}

					if(Opaque)
						m_aTileFlags[TileID] |= TILEFLAG_OPAQUE;
				}
		}
	}
}